

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O3

void __thiscall HighsSimplexAnalysis::iterationRecordMajor(HighsSimplexAnalysis *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = this->multi_chosen;
  uVar3 = this->multi_finished;
  uVar2 = this->sum_multi_chosen;
  uVar4 = this->sum_multi_finished;
  this->sum_multi_chosen = uVar2 + uVar1;
  this->sum_multi_finished = uVar4 + uVar3;
  uVar5 = -(ulong)(this->average_concurrency < 0.0);
  uVar6 = -(ulong)(this->average_fraction_of_possible_minor_iterations_performed < 0.0);
  this->average_concurrency =
       (double)(~uVar5 & (ulong)((double)this->num_concurrency * 0.05 +
                                this->average_concurrency * 0.95) |
               (ulong)(double)this->num_concurrency & uVar5);
  this->average_fraction_of_possible_minor_iterations_performed =
       (double)(~uVar6 & (ulong)(((double)(int)uVar3 / (double)(int)uVar1) * 0.05 +
                                this->average_fraction_of_possible_minor_iterations_performed * 0.95
                                ) | (ulong)((double)(int)uVar3 / (double)(int)uVar1) & uVar6);
  return;
}

Assistant:

void HighsSimplexAnalysis::iterationRecordMajor() {
  assert(analyse_simplex_summary_data);
  sum_multi_chosen += multi_chosen;
  sum_multi_finished += multi_finished;
  assert(multi_chosen > 0);
  const double fraction_of_possible_minor_iterations_performed =
      1.0 * multi_finished / multi_chosen;
  if (average_fraction_of_possible_minor_iterations_performed < 0) {
    average_fraction_of_possible_minor_iterations_performed =
        fraction_of_possible_minor_iterations_performed;
  } else {
    average_fraction_of_possible_minor_iterations_performed =
        kRunningAverageMultiplier *
            fraction_of_possible_minor_iterations_performed +
        (1 - kRunningAverageMultiplier) *
            average_fraction_of_possible_minor_iterations_performed;
  }
  if (average_concurrency < 0) {
    average_concurrency = num_concurrency;
  } else {
    average_concurrency = kRunningAverageMultiplier * num_concurrency +
                          (1 - kRunningAverageMultiplier) * average_concurrency;
  }
}